

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgFrame.c
# Opt level: O3

uint zvgFrameOpen(void)

{
  uint uVar1;
  
  uVar1 = zvgInit();
  if ((((uVar1 != 0) || (uVar1 = zvgReadDeviceID(&ZvgID), uVar1 != 0)) ||
      (uVar1 = zvgReadMonitorInfo(&ZvgMon), uVar1 != 0)) ||
     (uVar1 = zvgReadSpeedInfo(ZvgSpeeds), uVar1 != 0)) {
    zvgClose();
    return uVar1;
  }
  zvgEncReset();
  zvgEncSetPtr(EncodeBfr);
  if ((ZvgIO.envMonitor & 1) != 0) {
    ZvgENC.encFlags._0_1_ = (byte)ZvgENC.encFlags | 1;
  }
  if ((ZvgIO.envMonitor & 2) != 0) {
    ZvgENC.encFlags._0_1_ = (byte)ZvgENC.encFlags | 2;
  }
  if ((ZvgIO.envMonitor & 4) != 0) {
    ZvgENC.encFlags._0_1_ = (byte)ZvgENC.encFlags | 4;
  }
  if ((ZvgIO.envMonitor & 8) != 0) {
    ZvgENC.encFlags._0_1_ = (byte)ZvgENC.encFlags | 8;
  }
  if ((ZvgIO.envMonitor & 0x10) == 0) {
    return 0;
  }
  ZvgENC.encFlags._0_1_ = (byte)ZvgENC.encFlags | 0x10;
  zvgEncSetClipNoOverscan();
  return 0;
}

Assistant:

uint zvgFrameOpen( void)
{

	uint	err;

	// look for the ZVG

	err = zvgInit();

	// read IEEE version information data from ZVG

	if (!err)
		err = zvgReadDeviceID( &ZvgID);

	// read Monitor setup information from ZVG

	if (!err)
		err = zvgReadMonitorInfo( &ZvgMon);

	// read Speed table information for ZVG

	if (!err)
		err = zvgReadSpeedInfo( ZvgSpeeds);

	// reset the ZVG encoder, point to encoder scratch buffer

	if (!err)
	{	zvgEncReset();							// reset ZVG encoder
		zvgEncSetPtr( EncodeBfr);					// point to local encode buffer

		// move monitor flags from environment variable to encoder flags

		if (ZvgIO.envMonitor & MONF_FLIPX)
			ZvgENC.encFlags |= ENCF_FLIPX;

		if (ZvgIO.envMonitor & MONF_FLIPY)
			ZvgENC.encFlags |= ENCF_FLIPY;

		if (ZvgIO.envMonitor & MONF_SPOTKILL)
			ZvgENC.encFlags |= ENCF_SPOTKILL;

		if (ZvgIO.envMonitor & MONF_BW)
			ZvgENC.encFlags |= ENCF_BW;

		if (ZvgIO.envMonitor & MONF_NOOVS)
		{	ZvgENC.encFlags |= ENCF_NOOVS;
			zvgEncSetClipNoOverscan();
		}
	}

	if (err)
		zvgClose();										// if any error occurred, fix everything

	return (err);
}